

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O0

int __thiscall QtMWidgets::StepperPrivate::bound(StepperPrivate *this,int val)

{
  int local_28;
  int local_24;
  int local_18;
  int v;
  int val_local;
  StepperPrivate *this_local;
  
  if (val < this->minimum) {
    if ((this->wrapping & 1U) == 0) {
      local_24 = this->minimum;
    }
    else {
      local_24 = this->maximum;
    }
    local_18 = local_24;
  }
  else {
    local_18 = val;
    if (this->maximum < val) {
      if ((this->wrapping & 1U) == 0) {
        local_28 = this->maximum;
      }
      else {
        local_28 = this->minimum;
      }
      local_18 = local_28;
    }
  }
  return local_18;
}

Assistant:

int
StepperPrivate::bound( int val ) const
{
	int v = val;

	if( v < minimum )
		v = wrapping ? maximum : minimum;
	else if( v > maximum )
		v = wrapping ? minimum : maximum;

	return v;
}